

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void f8n::debug::Stop(void)

{
  log_queue *plVar1;
  thread *ptVar2;
  undefined1 local_18 [8];
  unique_lock<std::recursive_mutex> lock;
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)local_18,&mutex);
  cancel = true;
  if ((thread != (thread *)0x0) && (queue != (log_queue *)0x0)) {
    log_queue::stop(queue);
    std::thread::join();
    ptVar2 = thread;
    if (thread != (thread *)0x0) {
      std::thread::~thread(thread);
      operator_delete(ptVar2,8);
    }
    plVar1 = queue;
    thread = (thread *)0x0;
    if (queue != (log_queue *)0x0) {
      log_queue::~log_queue(queue);
      operator_delete(plVar1,0xb0);
    }
    queue = (log_queue *)0x0;
  }
  std::
  vector<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
  ::clear(&backends);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_18);
  return;
}

Assistant:

void debug::Stop() {
    std::unique_lock<std::recursive_mutex> lock(mutex);

    cancel = true;

    if (thread && queue) {
        queue->stop();
        thread->join();

        delete thread;
        thread = nullptr;
        delete queue;
        queue = nullptr;
    }

    backends.clear();
}